

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel.cpp
# Opt level: O0

bool __thiscall QSqlTableModel::updateRowInTable(QSqlTableModel *this,int row,QSqlRecord *values)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  QSqlTableModelPrivate *this_00;
  QSqlDriver *pQVar4;
  QString *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar5;
  bool prepStatement;
  QSqlTableModelPrivate *d;
  QString where;
  QString stmt;
  QSqlRecord whereValues;
  QSqlRecord rec;
  QSqlError *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  char *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  undefined3 uVar6;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffef4;
  ErrorType type;
  QString *in_stack_ffffffffffffff00;
  QString *databaseText;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff20;
  int iVar8;
  long *plVar9;
  bool local_c9;
  undefined1 local_60 [24];
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  plVar9 = in_RDI;
  this_00 = d_func((QSqlTableModel *)0x16e189);
  iVar8 = (int)((ulong)plVar9 >> 0x20);
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QSqlRecord::QSqlRecord
            ((QSqlRecord *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
             (QSqlRecord *)in_stack_fffffffffffffec8);
  beforeUpdate((QSqlTableModel *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
               (QSqlRecord *)in_stack_fffffffffffffec8);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  primaryValues((QSqlTableModel *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                iVar8);
  pQVar4 = QSqlDatabase::driver(&this_00->db);
  bVar1 = (**(code **)(*(long *)pQVar4 + 0xb8))(pQVar4,4);
  bVar1 = bVar1 & 1;
  local_30 = 0xaaaaaaaaaaaaaaaa;
  local_28 = 0xaaaaaaaaaaaaaaaa;
  local_20 = 0xaaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(&this_00->db);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_30,pQVar4,2,&this_00->tableName,&local_10,bVar1 & 1);
  local_48 = 0xaaaaaaaaaaaaaaaa;
  local_40 = 0xaaaaaaaaaaaaaaaa;
  local_38 = 0xaaaaaaaaaaaaaaaa;
  pQVar4 = QSqlDatabase::driver(&this_00->db);
  (**(code **)(*(long *)pQVar4 + 0xa8))(&local_48,pQVar4,0,&this_00->tableName,&local_18,bVar1 & 1);
  bVar2 = QString::isEmpty((QString *)0x16e30c);
  uVar7 = CONCAT13(1,(int3)in_stack_fffffffffffffef0);
  iVar8 = in_ESI;
  if (!bVar2) {
    bVar2 = QString::isEmpty((QString *)0x16e326);
    uVar6 = (undefined3)uVar7;
    uVar7 = CONCAT13(1,uVar6);
    iVar8 = in_ESI;
    if ((!bVar2) && (uVar7 = CONCAT13(1,uVar6), -1 < in_ESI)) {
      QModelIndex::QModelIndex((QModelIndex *)0x16e355);
      iVar3 = (**(code **)(*in_RDI + 0x78))(in_RDI,local_60);
      uVar7 = CONCAT13(iVar3 <= in_ESI,(int3)uVar7);
      in_stack_fffffffffffffee4 = in_ESI;
    }
  }
  if ((char)((uint)uVar7 >> 0x18) == '\0') {
    QSqlQueryModelSql::concat
              ((QString *)CONCAT17(bVar1,in_stack_ffffffffffffff08),in_stack_ffffffffffffff00);
    local_c9 = QSqlTableModelPrivate::exec
                         ((QSqlTableModelPrivate *)CONCAT44(iVar8,in_stack_ffffffffffffff20),in_RDX,
                          SUB81((ulong)this_00 >> 0x38,0),
                          (QSqlRecord *)CONCAT17(bVar1,in_stack_ffffffffffffff08),
                          (QSqlRecord *)in_stack_ffffffffffffff00);
    QString::~QString((QString *)0x16e4b2);
  }
  else {
    QVar5 = Qt::Literals::StringLiterals::operator____L1
                      (in_stack_fffffffffffffed8,
                       CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
    type = QVar5.m_size._4_4_;
    databaseText = (QString *)QVar5.m_data;
    QVar5.m_data._0_7_ = in_stack_ffffffffffffff08;
    QVar5.m_size = (qsizetype)databaseText;
    QVar5.m_data._7_1_ = bVar1;
    QString::QString((QString *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),QVar5)
    ;
    QString::QString((QString *)0x16e3c3);
    QString::QString((QString *)0x16e3d0);
    QSqlError::QSqlError
              ((QSqlError *)this_00,(QString *)CONCAT17(bVar1,in_stack_ffffffffffffff08),
               databaseText,type,(QString *)CONCAT44(in_stack_fffffffffffffef4,uVar7));
    QSqlError::operator=
              ((QSqlError *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8);
    QSqlError::~QSqlError((QSqlError *)0x16e420);
    QString::~QString((QString *)0x16e42d);
    QString::~QString((QString *)0x16e43a);
    QString::~QString((QString *)0x16e447);
    local_c9 = false;
  }
  QString::~QString((QString *)0x16e4c7);
  QString::~QString((QString *)0x16e4d4);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16e4e1);
  QSqlRecord::~QSqlRecord((QSqlRecord *)0x16e4ee);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_c9;
  }
  __stack_chk_fail();
}

Assistant:

bool QSqlTableModel::updateRowInTable(int row, const QSqlRecord &values)
{
    Q_D(QSqlTableModel);
    QSqlRecord rec(values);
    emit beforeUpdate(row, rec);

    const QSqlRecord whereValues = primaryValues(row);
    const bool prepStatement = d->db.driver()->hasFeature(QSqlDriver::PreparedQueries);
    const QString stmt = d->db.driver()->sqlStatement(QSqlDriver::UpdateStatement, d->tableName,
                                                     rec, prepStatement);
    const QString where = d->db.driver()->sqlStatement(QSqlDriver::WhereStatement, d->tableName,
                                                       whereValues, prepStatement);

    if (stmt.isEmpty() || where.isEmpty() || row < 0 || row >= rowCount()) {
        d->error = QSqlError("No Fields to update"_L1, QString(), QSqlError::StatementError);
        return false;
    }

    return d->exec(SqlTm::concat(stmt, where), prepStatement, rec, whereValues);
}